

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

int secp256k1_fe_equal(secp256k1_fe *a,secp256k1_fe *b)

{
  uint *puVar1;
  uint *puVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  int iVar8;
  int extraout_EAX;
  int extraout_EAX_00;
  long lVar9;
  uchar *in_RCX;
  secp256k1_sha256 *psVar10;
  ulong uVar11;
  secp256k1_pubkey *pubkey;
  secp256k1_ecmult_gen_context *extraout_RDX;
  secp256k1_fe *psVar12;
  uchar *seckey;
  secp256k1_ecmult_gen_context *a_00;
  secp256k1_ecmult_gen_context *psVar13;
  uint64_t uVar14;
  uchar *puVar15;
  ulong uVar16;
  secp256k1_ecmult_gen_context *a_01;
  secp256k1_ecmult_gen_context *psVar17;
  secp256k1_context *ctx;
  ulong uVar18;
  ulong uVar19;
  secp256k1_ecmult_gen_context *psVar20;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx;
  uint64_t uVar21;
  secp256k1_ecmult_gen_context *r;
  uint uVar22;
  uint64_t uVar23;
  ulong uVar24;
  secp256k1_fe *psVar25;
  secp256k1_fe *psVar26;
  secp256k1_fe *psVar27;
  secp256k1_fe *psVar28;
  secp256k1_fe *psVar29;
  secp256k1_fe *psVar30;
  secp256k1_ecmult_gen_context *r_00;
  secp256k1_ecmult_gen_context *psVar31;
  uint64_t uVar32;
  secp256k1_ecmult_gen_context *psVar33;
  secp256k1_ecmult_gen_context *psVar34;
  secp256k1_ecmult_gen_context *a_02;
  undefined1 auVar35 [16];
  secp256k1_fe na;
  secp256k1_scalar asStack_5ac [17];
  secp256k1_ge sStack_568;
  secp256k1_sha256 sStack_500;
  secp256k1_fe sStack_498;
  secp256k1_ecmult_gen_context *psStack_468;
  secp256k1_ecmult_gen_context *psStack_460;
  secp256k1_fe *psStack_458;
  secp256k1_ecmult_gen_context *psStack_450;
  secp256k1_ecmult_gen_context *psStack_448;
  secp256k1_ecmult_gen_context *psStack_440;
  undefined1 auStack_438 [56];
  ulong uStack_400;
  undefined1 *puStack_3f8;
  ulong uStack_3f0;
  uchar *puStack_3e8;
  ulong uStack_3e0;
  undefined1 auStack_3d8 [56];
  uint64_t uStack_3a0;
  uint64_t uStack_398;
  uint64_t uStack_390;
  uchar *puStack_388;
  uint64_t uStack_380;
  undefined1 auStack_378 [56];
  uint64_t uStack_340;
  secp256k1_ecmult_gen_context *psStack_338;
  uint64_t uStack_330;
  uchar *puStack_328;
  uint64_t uStack_320;
  uint uStack_30c;
  secp256k1_sha256 *psStack_308;
  secp256k1_ecmult_gen_context *psStack_300;
  ulong uStack_2f8;
  secp256k1_ecmult_gen_context *psStack_2f0;
  secp256k1_ecmult_gen_context *psStack_2e8;
  ulong uStack_2e0;
  undefined1 auStack_2d8 [56];
  ulong uStack_2a0;
  ulong uStack_298;
  ulong uStack_290;
  uchar *puStack_288;
  ulong uStack_280;
  undefined1 auStack_278 [160];
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_180;
  undefined1 auStack_170 [72];
  undefined1 auStack_128 [152];
  secp256k1_fe *psStack_90;
  secp256k1_fe *psStack_88;
  secp256k1_fe *psStack_80;
  uint64_t local_70;
  uint64_t local_68;
  secp256k1_fe local_60;
  
  psStack_80 = (secp256k1_fe *)0x10f6cd;
  secp256k1_fe_verify(a);
  psStack_80 = (secp256k1_fe *)0x10f6d5;
  secp256k1_fe_verify(b);
  psStack_80 = (secp256k1_fe *)0x10f6e2;
  secp256k1_fe_verify_magnitude(a,1);
  psStack_80 = (secp256k1_fe *)0x10f6ef;
  secp256k1_fe_verify_magnitude(b,0x1f);
  psStack_80 = (secp256k1_fe *)0x10f6f7;
  secp256k1_fe_verify(a);
  puVar15 = (uchar *)0x1;
  psStack_80 = (secp256k1_fe *)0x10f704;
  secp256k1_fe_verify_magnitude(a,1);
  local_68 = 0x3ffffbfffff0bc - a->n[0];
  uVar21 = 0x3ffffffffffffc - a->n[1];
  uVar14 = 0x3ffffffffffffc - a->n[2];
  local_70 = 0x3ffffffffffffc - a->n[3];
  uVar23 = 0x3fffffffffffc - a->n[4];
  local_60.magnitude = 2;
  local_60.normalized = 0;
  psStack_80 = (secp256k1_fe *)0x10f76d;
  local_60.n[0] = local_68;
  local_60.n[1] = uVar21;
  local_60.n[2] = uVar14;
  local_60.n[3] = local_70;
  local_60.n[4] = uVar23;
  secp256k1_fe_verify(&local_60);
  psStack_80 = (secp256k1_fe *)0x10f775;
  secp256k1_fe_verify(&local_60);
  psStack_80 = (secp256k1_fe *)0x10f77d;
  ctx = (secp256k1_context *)b;
  secp256k1_fe_verify(b);
  if (b->magnitude < 0x1f) {
    uVar32 = local_68 + b->n[0];
    uVar21 = uVar21 + b->n[1];
    uVar14 = uVar14 + b->n[2];
    local_70 = local_70 + b->n[3];
    uVar24 = uVar23 + b->n[4];
    local_60.normalized = 0;
    local_60.magnitude = b->magnitude + 2;
    psStack_80 = (secp256k1_fe *)0x10f7da;
    local_60.n[0] = uVar32;
    local_60.n[1] = uVar21;
    local_60.n[2] = uVar14;
    local_60.n[3] = local_70;
    local_60.n[4] = uVar24;
    secp256k1_fe_verify(&local_60);
    psStack_80 = (secp256k1_fe *)0x10f7e2;
    secp256k1_fe_verify(&local_60);
    uVar16 = (uVar24 >> 0x30) * 0x1000003d1 + uVar32;
    uVar11 = (uVar16 >> 0x34) + uVar21;
    uVar18 = (uVar11 >> 0x34) + uVar14;
    uVar19 = (uVar18 >> 0x34) + local_70;
    uVar24 = (uVar19 >> 0x34) + (uVar24 & 0xffffffffffff);
    return (int)(((uVar16 ^ 0x1000003d0) & uVar11 & uVar18 & uVar19 & (uVar24 ^ 0xf000000000000)) ==
                 0xfffffffffffff ||
                ((uVar11 | uVar16 | uVar18 | uVar19) & 0xfffffffffffff) == 0 && uVar24 == 0);
  }
  psStack_80 = (secp256k1_fe *)secp256k1_ellswift_encode;
  secp256k1_fe_equal_cold_1();
  psStack_90 = b;
  psStack_88 = a;
  psStack_80 = &local_60;
  if (ctx == (secp256k1_context *)0x0) {
    auStack_278._128_8_ = 0x10f9b5;
    secp256k1_ellswift_encode_cold_5();
LAB_0010f9b5:
    auStack_278._128_8_ = 0x10f9ba;
    secp256k1_ellswift_encode_cold_4();
    return 0;
  }
  if (puVar15 == (uchar *)0x0) goto LAB_0010f9b5;
  if (pubkey == (secp256k1_pubkey *)0x0) {
    auStack_278._128_8_ = 0x10f9c1;
    secp256k1_ellswift_encode_cold_3();
    return 0;
  }
  if (in_RCX == (uchar *)0x0) {
    auStack_278._128_8_ = 0x10f9c8;
    secp256k1_ellswift_encode_cold_2();
    return 0;
  }
  auStack_278._128_8_ = 0x10f8c6;
  iVar8 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)auStack_128,pubkey);
  if (iVar8 == 0) {
    puVar15[0x30] = '\0';
    puVar15[0x31] = '\0';
    puVar15[0x32] = '\0';
    puVar15[0x33] = '\0';
    puVar15[0x34] = '\0';
    puVar15[0x35] = '\0';
    puVar15[0x36] = '\0';
    puVar15[0x37] = '\0';
    puVar15[0x38] = '\0';
    puVar15[0x39] = '\0';
    puVar15[0x3a] = '\0';
    puVar15[0x3b] = '\0';
    puVar15[0x3c] = '\0';
    puVar15[0x3d] = '\0';
    puVar15[0x3e] = '\0';
    puVar15[0x3f] = '\0';
    puVar15[0x20] = '\0';
    puVar15[0x21] = '\0';
    puVar15[0x22] = '\0';
    puVar15[0x23] = '\0';
    puVar15[0x24] = '\0';
    puVar15[0x25] = '\0';
    puVar15[0x26] = '\0';
    puVar15[0x27] = '\0';
    puVar15[0x28] = '\0';
    puVar15[0x29] = '\0';
    puVar15[0x2a] = '\0';
    puVar15[0x2b] = '\0';
    puVar15[0x2c] = '\0';
    puVar15[0x2d] = '\0';
    puVar15[0x2e] = '\0';
    puVar15[0x2f] = '\0';
    puVar15[0x10] = '\0';
    puVar15[0x11] = '\0';
    puVar15[0x12] = '\0';
    puVar15[0x13] = '\0';
    puVar15[0x14] = '\0';
    puVar15[0x15] = '\0';
    puVar15[0x16] = '\0';
    puVar15[0x17] = '\0';
    puVar15[0x18] = '\0';
    puVar15[0x19] = '\0';
    puVar15[0x1a] = '\0';
    puVar15[0x1b] = '\0';
    puVar15[0x1c] = '\0';
    puVar15[0x1d] = '\0';
    puVar15[0x1e] = '\0';
    puVar15[0x1f] = '\0';
    puVar15[0] = '\0';
    puVar15[1] = '\0';
    puVar15[2] = '\0';
    puVar15[3] = '\0';
    puVar15[4] = '\0';
    puVar15[5] = '\0';
    puVar15[6] = '\0';
    puVar15[7] = '\0';
    puVar15[8] = '\0';
    puVar15[9] = '\0';
    puVar15[10] = '\0';
    puVar15[0xb] = '\0';
    puVar15[0xc] = '\0';
    puVar15[0xd] = '\0';
    puVar15[0xe] = '\0';
    puVar15[0xf] = '\0';
    return 0;
  }
  psVar13 = (secp256k1_ecmult_gen_context *)auStack_170;
  auStack_170._48_4_ = 0;
  auStack_170._52_4_ = 0;
  auStack_170._56_8_ = 0;
  auStack_170._32_8_ = 0;
  auStack_170._40_8_ = 0;
  auStack_170._16_8_ = 0;
  auStack_170._24_8_ = 0;
  auStack_170._0_4_ = 0;
  auStack_170._4_4_ = 0;
  auStack_170._8_8_ = 0;
  auStack_278._152_4_ = -0x2e59adb5;
  auStack_278._156_4_ = 0x28594b3;
  uStack_1d8 = 0x1037a17796e42f4e;
  uStack_1d0 = 0x560238851b8fcb8b;
  uStack_1c8 = 0xd626b7152560ede1;
  uStack_180 = 0x40;
  psVar20 = (secp256k1_ecmult_gen_context *)auStack_128;
  psVar10 = (secp256k1_sha256 *)0x1;
  auStack_278._128_8_ = 0x10f920;
  iVar8 = secp256k1_eckey_pubkey_serialize
                    ((secp256k1_ge *)psVar20,(uchar *)psVar13,(size_t *)(auStack_278 + 0x90),1);
  if ((iVar8 != 0) && (auStack_278._144_8_ == 0x21)) {
    psVar10 = (secp256k1_sha256 *)(auStack_278 + 0x98);
    auStack_278._128_8_ = 0x10f94e;
    secp256k1_sha256_write(psVar10,auStack_170,0x40);
    auStack_278._128_8_ = 0x10f95e;
    secp256k1_sha256_write(psVar10,in_RCX,0x20);
    auStack_278._128_8_ = 0x10f97c;
    secp256k1_ellswift_elligatorswift_var
              (puVar15,(secp256k1_fe *)(auStack_128 + 0x68),(secp256k1_ge *)auStack_128,psVar10);
    auStack_278._128_8_ = 0x10f98b;
    secp256k1_fe_get_b32(puVar15 + 0x20,(secp256k1_fe *)(auStack_128 + 0x68));
    return 1;
  }
  auStack_278._128_8_ = secp256k1_ellswift_elligatorswift_var;
  secp256k1_ellswift_encode_cold_1();
  auStack_278._128_8_ = uVar14;
  auStack_278._120_8_ = &local_60;
  auStack_278._112_8_ = in_RCX;
  auStack_278._104_8_ = uVar23;
  auStack_278._96_8_ = uVar21;
  auStack_278._88_8_ = puVar15;
  a_00 = (secp256k1_ecmult_gen_context *)auStack_438;
  psVar26 = (secp256k1_fe *)auStack_438;
  a_02 = (secp256k1_ecmult_gen_context *)auStack_438;
  psVar33 = (secp256k1_ecmult_gen_context *)auStack_438;
  psVar27 = (secp256k1_fe *)auStack_438;
  psVar12 = (secp256k1_fe *)auStack_438;
  psVar28 = (secp256k1_fe *)auStack_438;
  psVar29 = (secp256k1_fe *)auStack_438;
  psVar30 = (secp256k1_fe *)auStack_438;
  psVar17 = (secp256k1_ecmult_gen_context *)auStack_438;
  psStack_300 = extraout_RDX;
  psStack_2f0 = psVar13;
  psStack_2e8 = psVar20;
  r = (secp256k1_ecmult_gen_context *)0xfffffffffffff;
  psVar13 = (secp256k1_ecmult_gen_context *)(auStack_378 + 0x30);
  psVar20 = (secp256k1_ecmult_gen_context *)(auStack_438 + 0x30);
  uVar16 = 0;
  psStack_308 = psVar10;
  uVar11 = 0;
LAB_0010fa1b:
  iVar8 = (int)uVar11;
  if (iVar8 == 0) {
    psStack_440 = (secp256k1_ecmult_gen_context *)0x10fa33;
    secp256k1_ellswift_prng(auStack_278 + 0x30,psStack_308,(uint32_t)uVar16);
    iVar8 = 0x40;
    uVar16 = (ulong)((uint32_t)uVar16 + 1);
  }
  psVar34 = psStack_2e8;
  uStack_2f8 = (ulong)(iVar8 - 1U);
  bVar3 = auStack_278[(ulong)(iVar8 - 1U >> 1) + 0x30];
  psVar25 = (secp256k1_fe *)(ulong)bVar3;
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fa73;
  uStack_2e0 = uVar16;
  secp256k1_ellswift_prng((uchar *)psStack_2e8,psStack_308,(uint32_t)uVar16);
  r_00 = (secp256k1_ecmult_gen_context *)auStack_2d8;
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fa86;
  secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)r_00,(uchar *)psVar34);
  auStack_2d8._40_8_ = 1;
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fa9a;
  secp256k1_fe_verify((secp256k1_fe *)r_00);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10faa2;
  secp256k1_fe_verify((secp256k1_fe *)r_00);
  uVar11 = ((ulong)auStack_2d8._32_8_ >> 0x30) * 0x1000003d1 + auStack_2d8._0_8_;
  if (((uVar11 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar11 & 0xfffffffffffff) == 0)) {
    uVar16 = (uVar11 >> 0x34) + auStack_2d8._8_8_;
    a_01 = (secp256k1_ecmult_gen_context *)((uVar16 >> 0x34) + auStack_2d8._16_8_);
    ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(((ulong)a_01 >> 0x34) + auStack_2d8._24_8_);
    uVar18 = ((ulong)ecmult_gen_ctx >> 0x34) + (auStack_2d8._32_8_ & 0xffffffffffff);
    puVar15 = (uchar *)((uVar16 | uVar11 | (ulong)a_01 | (ulong)ecmult_gen_ctx) & 0xfffffffffffff |
                       uVar18);
    if ((puVar15 != (uchar *)0x0) &&
       (puVar15 = (uchar *)0x1000003d1,
       (uVar11 + 0x1000003d0 & uVar16 & (ulong)a_01 & (ulong)ecmult_gen_ctx &
       (uVar18 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0010fb73;
LAB_001108f8:
    psVar33 = psVar34;
    psStack_440 = (secp256k1_ecmult_gen_context *)0x1108fd;
    secp256k1_ellswift_elligatorswift_var_cold_1();
LAB_001108fd:
    psStack_440 = (secp256k1_ecmult_gen_context *)0x110902;
    secp256k1_ellswift_elligatorswift_var_cold_7();
    psVar34 = psVar33;
LAB_00110902:
    psVar27 = psVar25;
    psStack_440 = (secp256k1_ecmult_gen_context *)0x110907;
    secp256k1_ellswift_elligatorswift_var_cold_14();
LAB_00110907:
    psStack_440 = (secp256k1_ecmult_gen_context *)0x11090c;
    secp256k1_ellswift_elligatorswift_var_cold_6();
    psVar12 = psVar27;
LAB_0011090c:
    psStack_440 = (secp256k1_ecmult_gen_context *)0x110911;
    secp256k1_ellswift_elligatorswift_var_cold_5();
    psVar28 = psVar12;
LAB_00110911:
    psStack_440 = (secp256k1_ecmult_gen_context *)0x110916;
    secp256k1_ellswift_elligatorswift_var_cold_4();
    goto LAB_00110916;
  }
LAB_0010fb73:
  bVar3 = bVar3 >> ((char)uStack_2f8 * '\x04' & 4U);
  uVar22 = (uint)bVar3;
  psVar25 = (secp256k1_fe *)(ulong)uVar22;
  auStack_3d8._48_4_ = psStack_300->built;
  auStack_3d8._52_4_ = psStack_300->scalar_offset;
  uStack_3a0 = (psStack_300->ge_offset).x.n[0];
  uStack_398 = (psStack_300->ge_offset).x.n[1];
  uStack_390 = (psStack_300->ge_offset).x.n[2];
  puStack_388 = (uchar *)(psStack_300->ge_offset).x.n[3];
  uStack_380 = (psStack_300->ge_offset).x.n[4];
  puStack_328 = (uchar *)auStack_2d8._32_8_;
  uStack_320 = auStack_2d8._40_8_;
  psStack_338 = (secp256k1_ecmult_gen_context *)auStack_2d8._16_8_;
  uStack_330 = auStack_2d8._24_8_;
  auStack_378._48_8_ = auStack_2d8._0_8_;
  uStack_340 = auStack_2d8._8_8_;
  r_00 = (secp256k1_ecmult_gen_context *)(auStack_3d8 + 0x30);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fbf3;
  secp256k1_fe_verify((secp256k1_fe *)r_00);
  uVar11 = ((ulong)puStack_388 >> 0x30) * 0x1000003d1 + auStack_3d8._48_8_;
  uVar16 = (uVar11 >> 0x34) + uStack_3a0;
  uVar18 = (uVar16 >> 0x34) + uStack_398;
  uVar19 = (uVar18 >> 0x34) + uStack_390;
  uStack_390 = uVar19 & 0xfffffffffffff;
  puStack_388 = (uchar *)((uVar19 >> 0x34) + ((ulong)puStack_388 & 0xffffffffffff));
  uStack_398 = uVar18 & 0xfffffffffffff;
  uStack_3a0 = uVar16 & 0xfffffffffffff;
  auStack_3d8._48_8_ = uVar11 & 0xfffffffffffff;
  uStack_380 = CONCAT44(uStack_380._4_4_,1);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fca7;
  secp256k1_fe_verify((secp256k1_fe *)r_00);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fcaf;
  secp256k1_fe_verify((secp256k1_fe *)psVar13);
  auStack_378._48_8_ = ((ulong)puStack_328 >> 0x30) * 0x1000003d1 + auStack_378._48_8_;
  uStack_340 = ((ulong)auStack_378._48_8_ >> 0x34) + uStack_340;
  uVar11 = (uStack_340 >> 0x34) + (long)psStack_338;
  uVar16 = (uVar11 >> 0x34) + uStack_330;
  uStack_330 = uVar16 & 0xfffffffffffff;
  puVar15 = (uchar *)((ulong)puStack_328 & 0xffffffffffff);
  puStack_328 = puVar15 + (uVar16 >> 0x34);
  a_01 = (secp256k1_ecmult_gen_context *)(uVar11 & 0xfffffffffffff);
  uStack_340 = uStack_340 & 0xfffffffffffff;
  auStack_378._48_8_ = auStack_378._48_8_ & 0xfffffffffffff;
  uStack_320 = CONCAT44(uStack_320._4_4_,1);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fd59;
  psStack_338 = a_01;
  secp256k1_fe_verify((secp256k1_fe *)psVar13);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fd61;
  ecmult_gen_ctx = r_00;
  iVar8 = secp256k1_ge_x_on_curve_var((secp256k1_fe *)r_00);
  if (iVar8 == 0) {
    psStack_440 = (secp256k1_ecmult_gen_context *)0x1108f8;
    secp256k1_ellswift_elligatorswift_var_cold_15();
    psVar34 = (secp256k1_ecmult_gen_context *)0xfffffffffffff;
    goto LAB_001108f8;
  }
  r_00 = (secp256k1_ecmult_gen_context *)(ulong)uVar22;
  if ((bVar3 & 2) != 0) {
    psStack_440 = (secp256k1_ecmult_gen_context *)0x1100a2;
    secp256k1_fe_verify((secp256k1_fe *)psVar13);
    a_01 = (secp256k1_ecmult_gen_context *)0x1;
    psStack_440 = (secp256k1_ecmult_gen_context *)0x1100af;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)psVar13,1);
    auStack_438._48_8_ = 0x3ffffbfffff0bc - auStack_378._48_8_;
    uStack_400 = 0x3ffffffffffffc - uStack_340;
    puStack_3f8 = (undefined1 *)(0x3ffffffffffffc - (long)psStack_338);
    uStack_3f0 = 0x3ffffffffffffc - uStack_330;
    puStack_3e8 = (uchar *)(0x3fffffffffffc - (long)puStack_328);
    uStack_3e0 = 2;
    psStack_440 = (secp256k1_ecmult_gen_context *)0x110105;
    secp256k1_fe_verify((secp256k1_fe *)psVar20);
    auStack_438._32_8_ = puStack_3e8;
    auStack_438._40_8_ = uStack_3e0;
    auStack_438._16_8_ = puStack_3f8;
    auStack_438._24_8_ = uStack_3f0;
    auStack_438._0_8_ = auStack_438._48_8_;
    auStack_438._8_8_ = uStack_400;
    psStack_440 = (secp256k1_ecmult_gen_context *)0x11012f;
    secp256k1_fe_verify((secp256k1_fe *)auStack_438);
    ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(auStack_3d8 + 0x30);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x11013c;
    secp256k1_fe_verify((secp256k1_fe *)ecmult_gen_ctx);
    if (0x20 < (int)uStack_380 + auStack_438._40_4_) goto LAB_001108fd;
    auStack_438._0_8_ = auStack_438._0_8_ + auStack_3d8._48_8_;
    auStack_438._8_8_ = auStack_438._8_8_ + uStack_3a0;
    auStack_438._16_8_ = auStack_438._16_8_ + uStack_398;
    auStack_438._24_8_ = auStack_438._24_8_ + uStack_390;
    auStack_438._32_8_ = auStack_438._32_8_ + (long)puStack_388;
    auStack_438._44_4_ = 0;
    auStack_438._40_4_ = (int)uStack_380 + auStack_438._40_4_;
    psStack_440 = (secp256k1_ecmult_gen_context *)0x110199;
    puVar15 = puStack_388;
    secp256k1_fe_verify((secp256k1_fe *)auStack_438);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x1101a1;
    iVar8 = secp256k1_fe_is_square_var((secp256k1_fe *)auStack_438);
    if (iVar8 == 0) goto LAB_001105e1;
    psVar34 = (secp256k1_ecmult_gen_context *)auStack_378;
    psStack_440 = (secp256k1_ecmult_gen_context *)0x1101c7;
    uStack_30c = uVar22;
    secp256k1_fe_sqr((secp256k1_fe *)psVar34,(secp256k1_fe *)psVar13);
    r_00 = (secp256k1_ecmult_gen_context *)auStack_3d8;
    psStack_440 = (secp256k1_ecmult_gen_context *)0x1101da;
    a_01 = (secp256k1_ecmult_gen_context *)auStack_438;
    secp256k1_fe_mul((secp256k1_fe *)r_00,(secp256k1_fe *)auStack_438,(secp256k1_fe *)psVar34);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x1101e2;
    ecmult_gen_ctx = r_00;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    if (10 < (int)auStack_3d8._40_4_) goto LAB_00110907;
    auStack_3d8._0_8_ = auStack_3d8._0_8_ * 3;
    auStack_3d8._8_8_ = auStack_3d8._8_8_ * 3;
    auStack_3d8._16_8_ = auStack_3d8._16_8_ * 3;
    auStack_3d8._24_8_ = auStack_3d8._24_8_ * 3;
    puVar15 = (uchar *)(auStack_3d8._32_8_ * 3);
    auStack_3d8._44_4_ = 0;
    auStack_3d8._40_4_ = auStack_3d8._40_4_ * 3;
    psStack_440 = (secp256k1_ecmult_gen_context *)0x11025b;
    auStack_3d8._32_8_ = puVar15;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x110269;
    a_01 = psVar34;
    secp256k1_fe_mul((secp256k1_fe *)psVar34,(secp256k1_fe *)psVar34,(secp256k1_fe *)psVar13);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x110271;
    ecmult_gen_ctx = psVar34;
    secp256k1_fe_verify((secp256k1_fe *)psVar34);
    if (8 < (int)auStack_378._40_4_) goto LAB_0011090c;
    auStack_378._0_8_ = auStack_378._0_8_ << 2;
    auStack_378._8_8_ = auStack_378._8_8_ << 2;
    auStack_378._16_8_ = auStack_378._16_8_ << 2;
    auStack_378._24_8_ = auStack_378._24_8_ << 2;
    auStack_378._32_8_ = auStack_378._32_8_ << 2;
    auStack_378._40_4_ = auStack_378._40_4_ << 2;
    auStack_378._44_4_ = 0;
    psStack_440 = (secp256k1_ecmult_gen_context *)0x1102da;
    secp256k1_fe_verify((secp256k1_fe *)auStack_378);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x1102e7;
    secp256k1_fe_verify((secp256k1_fe *)auStack_378);
    auStack_378._0_8_ = auStack_378._0_8_ + 8;
    auStack_378._40_4_ = auStack_378._40_4_ + 1;
    auStack_378._44_4_ = 0;
    psVar34 = (secp256k1_ecmult_gen_context *)auStack_378;
    psStack_440 = (secp256k1_ecmult_gen_context *)0x11030f;
    secp256k1_fe_verify((secp256k1_fe *)psVar34);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x110317;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x11031f;
    ecmult_gen_ctx = psVar34;
    secp256k1_fe_verify((secp256k1_fe *)psVar34);
    if (0x20 < (int)(auStack_378._40_4_ + auStack_3d8._40_4_)) goto LAB_00110911;
    auStack_3d8._0_8_ = auStack_3d8._0_8_ + auStack_378._0_8_;
    auStack_3d8._8_8_ = auStack_3d8._8_8_ + auStack_378._8_8_;
    auStack_3d8._16_8_ = auStack_3d8._16_8_ + auStack_378._16_8_;
    auStack_3d8._24_8_ = auStack_3d8._24_8_ + auStack_378._24_8_;
    auStack_3d8._32_8_ = auStack_3d8._32_8_ + auStack_378._32_8_;
    auStack_3d8._44_4_ = 0;
    auStack_3d8._40_4_ = auStack_378._40_4_ + auStack_3d8._40_4_;
    psStack_440 = (secp256k1_ecmult_gen_context *)0x11038a;
    puVar15 = (uchar *)auStack_378._32_8_;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x11039b;
    secp256k1_fe_mul((secp256k1_fe *)r_00,(secp256k1_fe *)r_00,(secp256k1_fe *)auStack_438);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x1103a3;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x1103b0;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)r_00,1);
    auStack_3d8._0_8_ = 0x3ffffbfffff0bc - auStack_3d8._0_8_;
    auStack_3d8._8_8_ = 0x3ffffffffffffc - auStack_3d8._8_8_;
    auStack_3d8._16_8_ = 0x3ffffffffffffc - auStack_3d8._16_8_;
    auStack_3d8._24_8_ = 0x3ffffffffffffc - auStack_3d8._24_8_;
    auStack_3d8._32_8_ = 0x3fffffffffffc - auStack_3d8._32_8_;
    auStack_3d8._40_8_ = 2;
    psStack_440 = (secp256k1_ecmult_gen_context *)0x110406;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x11040e;
    iVar8 = secp256k1_fe_is_square_var((secp256k1_fe *)r_00);
    uVar22 = uStack_30c;
    psVar31 = (secp256k1_ecmult_gen_context *)(ulong)uStack_30c;
    if (iVar8 != 0) {
      ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)auStack_278;
      a_01 = (secp256k1_ecmult_gen_context *)auStack_3d8;
      psStack_440 = (secp256k1_ecmult_gen_context *)0x110430;
      iVar8 = secp256k1_fe_sqrt((secp256k1_fe *)ecmult_gen_ctx,(secp256k1_fe *)a_01);
      psVar34 = (secp256k1_ecmult_gen_context *)auStack_438;
      if (iVar8 == 0) goto LAB_0011092a;
      if ((uVar22 & 1) != 0) {
        psStack_440 = (secp256k1_ecmult_gen_context *)0x11044f;
        secp256k1_fe_verify((secp256k1_fe *)auStack_278);
        uVar11 = ((ulong)auStack_278._32_8_ >> 0x30) * 0x1000003d1 + auStack_278._0_8_;
        if (((uVar11 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar11 & 0xfffffffffffff) == 0)) {
          uVar16 = (uVar11 >> 0x34) + auStack_278._8_8_;
          uVar18 = (uVar16 >> 0x34) + auStack_278._16_8_;
          uVar19 = (uVar18 >> 0x34) + auStack_278._24_8_;
          uVar24 = (uVar19 >> 0x34) + (auStack_278._32_8_ & 0xffffffffffff);
          if ((((uVar16 | uVar11 | uVar18 | uVar19) & 0xfffffffffffff) == 0 && uVar24 == 0) ||
             ((uVar11 + 0x1000003d0 & uVar16 & uVar18 & uVar19 & (uVar24 ^ 0xf000000000000)) ==
              0xfffffffffffff)) goto LAB_001105e1;
        }
      }
      psStack_440 = (secp256k1_ecmult_gen_context *)0x110528;
      secp256k1_fe_verify((secp256k1_fe *)auStack_438);
      uVar11 = ((ulong)auStack_438._32_8_ >> 0x30) * 0x1000003d1 + auStack_438._0_8_;
      if (((uVar11 & 0xfffffffffffff) == 0xffffefffffc2f) ||
         (puVar15 = (uchar *)auStack_438._32_8_, (uVar11 & 0xfffffffffffff) == 0)) {
        uVar16 = (uVar11 >> 0x34) + auStack_438._8_8_;
        uVar18 = (uVar16 >> 0x34) + auStack_438._16_8_;
        uVar19 = (uVar18 >> 0x34) + auStack_438._24_8_;
        uVar24 = (uVar19 >> 0x34) + (auStack_438._32_8_ & 0xffffffffffff);
        if ((((uVar16 | uVar11 | uVar18 | uVar19) & 0xfffffffffffff) == 0 && uVar24 == 0) ||
           (puVar15 = (uchar *)0x1000003d1,
           (uVar11 + 0x1000003d0 & uVar16 & uVar18 & uVar19 & (uVar24 ^ 0xf000000000000)) ==
           0xfffffffffffff)) goto LAB_001105e1;
      }
      psVar13 = (secp256k1_ecmult_gen_context *)(auStack_2d8 + 0x30);
      psStack_440 = (secp256k1_ecmult_gen_context *)0x110613;
      secp256k1_fe_inv_var((secp256k1_fe *)psVar13,(secp256k1_fe *)auStack_438);
      psStack_440 = (secp256k1_ecmult_gen_context *)0x110626;
      a_01 = psVar13;
      secp256k1_fe_mul((secp256k1_fe *)psVar13,(secp256k1_fe *)psVar13,(secp256k1_fe *)auStack_278);
      psStack_440 = (secp256k1_ecmult_gen_context *)0x11062e;
      secp256k1_fe_verify((secp256k1_fe *)psVar13);
      a_02 = (secp256k1_ecmult_gen_context *)(auStack_438 + 0x30);
      psStack_440 = (secp256k1_ecmult_gen_context *)0x11063b;
      ecmult_gen_ctx = a_02;
      secp256k1_fe_verify((secp256k1_fe *)a_02);
      if (0x20 < (int)uStack_3e0 + (int)uStack_280) goto LAB_0011092f;
      a_00 = (secp256k1_ecmult_gen_context *)(auStack_2d8 + 0x30);
      auStack_2d8._48_8_ = auStack_2d8._48_8_ + auStack_438._48_8_;
      uStack_2a0 = uStack_2a0 + uStack_400;
      uStack_298 = uStack_298 + (long)puStack_3f8;
      uStack_290 = uStack_290 + uStack_3f0;
      puStack_288 = puStack_288 + (long)puStack_3e8;
      uStack_280 = (ulong)(uint)((int)uStack_3e0 + (int)uStack_280);
      psStack_440 = (secp256k1_ecmult_gen_context *)0x11068c;
      puVar15 = puStack_3e8;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      psStack_440 = (secp256k1_ecmult_gen_context *)0x110694;
      secp256k1_fe_half((secp256k1_fe *)a_00);
      r_00 = psVar31;
      goto LAB_00110694;
    }
LAB_001105e1:
    uVar16 = (ulong)((int)uStack_2e0 + 1);
    uVar11 = uStack_2f8;
    goto LAB_0010fa1b;
  }
  puStack_3e8 = puStack_388;
  uStack_3e0 = uStack_380;
  puStack_3f8 = (undefined1 *)uStack_398;
  uStack_3f0 = uStack_390;
  auStack_438._48_8_ = auStack_3d8._48_8_;
  uStack_400 = uStack_3a0;
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fda7;
  secp256k1_fe_verify((secp256k1_fe *)psVar20);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fdaf;
  ecmult_gen_ctx = psVar13;
  secp256k1_fe_verify((secp256k1_fe *)psVar13);
  psVar34 = (secp256k1_ecmult_gen_context *)auStack_438;
  if (0x20 < (int)uStack_320 + (int)uStack_3e0) goto LAB_00110902;
  auStack_438._48_8_ = auStack_438._48_8_ + auStack_378._48_8_;
  uStack_400 = uStack_400 + uStack_340;
  puStack_3f8 = (undefined1 *)((long)(psStack_338->ge_offset).x.n + ((long)puStack_3f8 - 8U));
  uStack_3f0 = uStack_3f0 + uStack_330;
  puStack_3e8 = puStack_3e8 + (long)puStack_328;
  uStack_3e0 = (ulong)(uint)((int)uStack_320 + (int)uStack_3e0);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fe11;
  puVar15 = puStack_328;
  secp256k1_fe_verify((secp256k1_fe *)psVar20);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fe19;
  secp256k1_fe_verify((secp256k1_fe *)psVar20);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fe26;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)psVar20,2);
  auStack_438._48_8_ = 0x5ffff9ffffe91a - auStack_438._48_8_;
  uStack_400 = 0x5ffffffffffffa - uStack_400;
  puStack_3f8 = (undefined1 *)(0x5ffffffffffffa - (long)puStack_3f8);
  uStack_3f0 = 0x5ffffffffffffa - uStack_3f0;
  puStack_3e8 = (uchar *)(0x5fffffffffffa - (long)puStack_3e8);
  uStack_3e0 = 3;
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fe73;
  secp256k1_fe_verify((secp256k1_fe *)psVar20);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fe7b;
  iVar8 = secp256k1_ge_x_on_curve_var((secp256k1_fe *)psVar20);
  if (iVar8 != 0) goto LAB_001105e1;
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fe8e;
  secp256k1_fe_sqr((secp256k1_fe *)auStack_438,(secp256k1_fe *)psVar20);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fe96;
  secp256k1_fe_verify((secp256k1_fe *)auStack_438);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10fea3;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)auStack_438,1);
  auStack_438._0_8_ = 0x3ffffbfffff0bc - auStack_438._0_8_;
  auStack_438._8_8_ = 0x3ffffffffffffc - auStack_438._8_8_;
  auStack_438._16_8_ = 0x3ffffffffffffc - auStack_438._16_8_;
  auStack_438._24_8_ = 0x3ffffffffffffc - auStack_438._24_8_;
  auStack_438._32_8_ = 0x3fffffffffffc - auStack_438._32_8_;
  auStack_438._40_8_ = 2;
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10feee;
  secp256k1_fe_verify((secp256k1_fe *)auStack_438);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10ff01;
  a_01 = psVar13;
  secp256k1_fe_mul((secp256k1_fe *)psVar20,(secp256k1_fe *)psVar13,
                   (secp256k1_fe *)(auStack_3d8 + 0x30));
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10ff09;
  secp256k1_fe_verify((secp256k1_fe *)auStack_438);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10ff11;
  ecmult_gen_ctx = psVar20;
  secp256k1_fe_verify((secp256k1_fe *)psVar20);
  psVar31 = r_00;
  psVar34 = (secp256k1_ecmult_gen_context *)auStack_438;
  if (0x20 < (int)uStack_3e0 + auStack_438._40_4_) goto LAB_00110934;
  auStack_438._0_8_ = auStack_438._0_8_ + auStack_438._48_8_;
  auStack_438._8_8_ = auStack_438._8_8_ + uStack_400;
  auStack_438._16_8_ = auStack_438._16_8_ + (long)puStack_3f8;
  auStack_438._24_8_ = auStack_438._24_8_ + uStack_3f0;
  auStack_438._32_8_ = auStack_438._32_8_ + (long)puStack_3e8;
  auStack_438._44_4_ = 0;
  auStack_438._40_4_ = (int)uStack_3e0 + auStack_438._40_4_;
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10ff62;
  secp256k1_fe_verify((secp256k1_fe *)auStack_438);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x10ff6a;
  secp256k1_fe_verify((secp256k1_fe *)auStack_438);
  uVar11 = ((ulong)auStack_438._32_8_ >> 0x30) * 0x1000003d1 + auStack_438._0_8_;
  if (((uVar11 & 0xfffffffffffff) == 0xffffefffffc2f) ||
     (puVar15 = (uchar *)auStack_438._32_8_, (uVar11 & 0xfffffffffffff) == 0)) {
    uVar16 = (uVar11 >> 0x34) + auStack_438._8_8_;
    a_01 = (secp256k1_ecmult_gen_context *)((uVar16 >> 0x34) + auStack_438._16_8_);
    ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(((ulong)a_01 >> 0x34) + auStack_438._24_8_);
    uVar18 = ((ulong)ecmult_gen_ctx >> 0x34) + (auStack_438._32_8_ & 0xffffffffffff);
    puVar15 = (uchar *)((uVar16 | uVar11 | (ulong)a_01 | (ulong)ecmult_gen_ctx) & 0xfffffffffffff |
                       uVar18);
    psVar34 = (secp256k1_ecmult_gen_context *)auStack_438;
    if ((puVar15 == (uchar *)0x0) ||
       (puVar15 = (uchar *)0x1000003d1, psVar34 = (secp256k1_ecmult_gen_context *)auStack_438,
       (uVar11 + 0x1000003d0 & uVar16 & (ulong)a_01 & (ulong)ecmult_gen_ctx &
       (uVar18 ^ 0xf000000000000)) == 0xfffffffffffff)) goto LAB_00110939;
  }
  psStack_440 = (secp256k1_ecmult_gen_context *)0x11003e;
  secp256k1_fe_sqr((secp256k1_fe *)auStack_378,(secp256k1_fe *)psVar13);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x11004c;
  secp256k1_fe_mul((secp256k1_fe *)auStack_378,(secp256k1_fe *)auStack_378,(secp256k1_fe *)psVar13);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x110054;
  secp256k1_fe_verify((secp256k1_fe *)auStack_378);
  auStack_378._0_8_ = auStack_378._0_8_ + 2;
  auStack_378._40_4_ = auStack_378._40_4_ + 1;
  auStack_378._44_4_ = 0;
  psStack_440 = (secp256k1_ecmult_gen_context *)0x110077;
  secp256k1_fe_verify((secp256k1_fe *)auStack_378);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x110085;
  secp256k1_fe_mul((secp256k1_fe *)psVar20,(secp256k1_fe *)auStack_438,(secp256k1_fe *)auStack_378);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x11008d;
  iVar8 = secp256k1_fe_is_square_var((secp256k1_fe *)psVar20);
  if (iVar8 == 0) goto LAB_001105e1;
  psStack_440 = (secp256k1_ecmult_gen_context *)0x1108a5;
  secp256k1_fe_inv_var((secp256k1_fe *)auStack_438,(secp256k1_fe *)auStack_438);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x1108b8;
  secp256k1_fe_mul((secp256k1_fe *)auStack_438,(secp256k1_fe *)auStack_438,
                   (secp256k1_fe *)auStack_378);
  auStack_2d8._48_8_ = auStack_3d8._48_8_;
  uStack_2a0 = uStack_3a0;
  uStack_298 = uStack_398;
  uStack_290 = uStack_390;
  puStack_288 = puStack_388;
  uStack_280 = uStack_380;
  psVar26 = (secp256k1_fe *)auStack_378;
LAB_00110694:
  ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(auStack_438 + 0x30);
  psStack_440 = (secp256k1_ecmult_gen_context *)0x1106a1;
  iVar8 = secp256k1_fe_sqrt((secp256k1_fe *)ecmult_gen_ctx,(secp256k1_fe *)auStack_438);
  psVar13 = a_00;
  a_01 = psVar17;
  psVar28 = psVar26;
  psVar34 = a_02;
  if (iVar8 == 0) {
LAB_00110916:
    psStack_440 = (secp256k1_ecmult_gen_context *)0x11091b;
    secp256k1_ellswift_elligatorswift_var_cold_12();
LAB_0011091b:
    psStack_440 = (secp256k1_ecmult_gen_context *)0x110920;
    secp256k1_ellswift_elligatorswift_var_cold_11();
  }
  else {
    if ((((uint)r_00 & 5) == 5) || (((ulong)r_00 & 5) == 0)) {
      psVar12 = (secp256k1_fe *)(auStack_438 + 0x30);
      psStack_440 = (secp256k1_ecmult_gen_context *)0x1106c5;
      secp256k1_fe_verify(psVar12);
      psStack_440 = (secp256k1_ecmult_gen_context *)0x1106d2;
      secp256k1_fe_verify_magnitude(psVar12,1);
      auStack_438._48_8_ = 0x3ffffbfffff0bc - auStack_438._48_8_;
      uStack_400 = 0x3ffffffffffffc - uStack_400;
      puStack_3f8 = (undefined1 *)(0x3ffffffffffffc - (long)puStack_3f8);
      uStack_3f0 = 0x3ffffffffffffc - uStack_3f0;
      puStack_3e8 = (uchar *)(0x3fffffffffffc - (long)puStack_3e8);
      uStack_3e0 = 2;
      psStack_440 = (secp256k1_ecmult_gen_context *)0x110716;
      secp256k1_fe_verify(psVar12);
    }
    psVar12 = &secp256k1_ellswift_c4;
    if (((ulong)r_00 & 1) == 0) {
      psVar12 = &secp256k1_ellswift_c3;
    }
    psVar13 = (secp256k1_ecmult_gen_context *)(auStack_378 + 0x30);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x11073f;
    a_01 = psVar13;
    secp256k1_fe_mul((secp256k1_fe *)psVar13,(secp256k1_fe *)psVar13,psVar12);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x110747;
    secp256k1_fe_verify((secp256k1_fe *)psVar13);
    psVar34 = (secp256k1_ecmult_gen_context *)(auStack_2d8 + 0x30);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x110757;
    ecmult_gen_ctx = psVar34;
    secp256k1_fe_verify((secp256k1_fe *)psVar34);
    if (0x20 < (int)uStack_280 + (int)uStack_320) goto LAB_0011091b;
    psVar13 = (secp256k1_ecmult_gen_context *)(auStack_378 + 0x30);
    auStack_378._48_8_ = auStack_378._48_8_ + auStack_2d8._48_8_;
    uStack_340 = uStack_340 + uStack_2a0;
    psStack_338 = (secp256k1_ecmult_gen_context *)
                  ((long)(psStack_338->ge_offset).x.n + (uStack_298 - 8));
    uStack_330 = uStack_330 + uStack_290;
    puStack_328 = puStack_328 + (long)puStack_288;
    uStack_320 = (uint64_t)(uint)((int)uStack_280 + (int)uStack_320);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x1107b1;
    puVar15 = puStack_288;
    secp256k1_fe_verify((secp256k1_fe *)psVar13);
    r = psStack_2f0;
    a_01 = (secp256k1_ecmult_gen_context *)(auStack_438 + 0x30);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x1107c9;
    secp256k1_fe_mul((secp256k1_fe *)psStack_2f0,(secp256k1_fe *)a_01,(secp256k1_fe *)psVar13);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x1107d1;
    secp256k1_fe_normalize_var((secp256k1_fe *)r);
    psStack_440 = (secp256k1_ecmult_gen_context *)0x1107d9;
    ecmult_gen_ctx = r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    psVar31 = psStack_300;
    if (*(int *)((long)(r->ge_offset).x.n + 0x24) != 0) {
      psVar34 = *(secp256k1_ecmult_gen_context **)r;
      psVar13 = (secp256k1_ecmult_gen_context *)&(psStack_300->ge_offset).x.magnitude;
      psStack_440 = (secp256k1_ecmult_gen_context *)0x1107fd;
      ecmult_gen_ctx = psVar13;
      secp256k1_fe_verify((secp256k1_fe *)psVar13);
      psVar29 = psVar26;
      if (*(int *)((long)(psVar31->ge_offset).y.n + 0x24) != 0) {
        iVar8 = extraout_EAX;
        if ((((uint)psVar34 ^ *(uint *)psVar13) & 1) != 0) {
          psStack_440 = (secp256k1_ecmult_gen_context *)0x110819;
          secp256k1_fe_verify((secp256k1_fe *)r);
          psStack_440 = (secp256k1_ecmult_gen_context *)0x110826;
          secp256k1_fe_verify_magnitude((secp256k1_fe *)r,1);
          uVar14 = (r->ge_offset).x.n[0];
          uVar21 = (r->ge_offset).x.n[1];
          uVar23 = (r->ge_offset).x.n[2];
          *(long *)r = 0x3ffffbfffff0bc - *(long *)r;
          (r->ge_offset).x.n[0] = 0x3ffffffffffffc - uVar14;
          (r->ge_offset).x.n[1] = 0x3ffffffffffffc - uVar21;
          (r->ge_offset).x.n[2] = 0x3ffffffffffffc - uVar23;
          (r->ge_offset).x.n[3] = 0x3fffffffffffc - (r->ge_offset).x.n[3];
          (r->ge_offset).x.n[4] = 2;
          psStack_440 = (secp256k1_ecmult_gen_context *)0x11087d;
          secp256k1_fe_verify((secp256k1_fe *)r);
          psStack_440 = (secp256k1_ecmult_gen_context *)0x110885;
          secp256k1_fe_normalize_var((secp256k1_fe *)r);
          iVar8 = extraout_EAX_00;
        }
        return iVar8;
      }
      goto LAB_00110925;
    }
  }
  psVar31 = r_00;
  psStack_440 = (secp256k1_ecmult_gen_context *)0x110925;
  secp256k1_ellswift_elligatorswift_var_cold_10();
  psVar29 = psVar28;
LAB_00110925:
  psStack_440 = (secp256k1_ecmult_gen_context *)0x11092a;
  secp256k1_ellswift_elligatorswift_var_cold_9();
LAB_0011092a:
  a_02 = psVar34;
  psStack_440 = (secp256k1_ecmult_gen_context *)0x11092f;
  secp256k1_ellswift_elligatorswift_var_cold_3();
  psVar30 = psVar29;
LAB_0011092f:
  psStack_440 = (secp256k1_ecmult_gen_context *)0x110934;
  secp256k1_ellswift_elligatorswift_var_cold_2();
  psVar25 = psVar30;
  psVar34 = a_02;
LAB_00110934:
  psStack_440 = (secp256k1_ecmult_gen_context *)0x110939;
  secp256k1_ellswift_elligatorswift_var_cold_13();
LAB_00110939:
  psStack_440 = (secp256k1_ecmult_gen_context *)secp256k1_ellswift_create;
  secp256k1_ellswift_elligatorswift_var_cold_8();
  psStack_468 = psVar13;
  psStack_460 = r;
  psStack_458 = psVar25;
  psStack_450 = psVar31;
  psStack_448 = psVar34;
  psStack_440 = psVar20;
  if (ecmult_gen_ctx == (secp256k1_ecmult_gen_context *)0x0) {
    secp256k1_ellswift_create_cold_6();
  }
  else if (a_01 != (secp256k1_ecmult_gen_context *)0x0) {
    *(undefined1 (*) [16])&(a_01->ge_offset).x.magnitude = (undefined1  [16])0x0;
    (a_01->ge_offset).x.n[3] = 0;
    (a_01->ge_offset).x.n[4] = 0;
    (a_01->ge_offset).x.n[1] = 0;
    (a_01->ge_offset).x.n[2] = 0;
    a_01->built = 0;
    a_01->scalar_offset = 0;
    (a_01->ge_offset).x.n[0] = 0;
    if (ecmult_gen_ctx->built == 0) {
      secp256k1_ellswift_create_cold_4();
      return 0;
    }
    if (seckey == (uchar *)0x0) {
      secp256k1_ellswift_create_cold_3();
      return 0;
    }
    iVar8 = secp256k1_ec_pubkey_create_helper(ecmult_gen_ctx,asStack_5ac,&sStack_568,seckey);
    if ((int)ecmult_gen_ctx[1].ge_offset.x.n[3] != 0) {
      secp256k1_ellswift_create_cold_1();
    }
    secp256k1_fe_normalize_var(&sStack_568.x);
    secp256k1_fe_normalize_var(&sStack_568.y);
    sStack_500.s[0] = 0xd29e1bf5;
    sStack_500.s[1] = 0xf7025f42;
    sStack_500.s[2] = 0x9b024773;
    sStack_500.s[3] = 0x94cb7d5;
    sStack_500.s[4] = 0xe59ed789;
    sStack_500.s[5] = 0x3bc9786;
    sStack_500.s[6] = 0x68335b35;
    sStack_500.s[7] = 0x4e363b53;
    sStack_500.bytes = 0x40;
    secp256k1_sha256_write(&sStack_500,seckey,0x20);
    secp256k1_sha256_write(&sStack_500,"",0x20);
    if ((int)ecmult_gen_ctx[1].ge_offset.x.n[3] != 0) {
      secp256k1_ellswift_create_cold_2();
    }
    if (puVar15 != (uchar *)0x0) {
      secp256k1_sha256_write(&sStack_500,puVar15,0x20);
    }
    secp256k1_ellswift_elligatorswift_var((uchar *)a_01,&sStack_498,&sStack_568,&sStack_500);
    secp256k1_fe_get_b32((uchar *)((a_01->ge_offset).x.n + 3),&sStack_498);
    cVar7 = ((byte)iVar8 ^ 1) - 1;
    auVar35 = ZEXT216(CONCAT11(cVar7,cVar7));
    auVar35 = pshuflw(auVar35,auVar35,0);
    uVar22 = auVar35._0_4_;
    lVar9 = 0;
    do {
      puVar1 = (uint *)((long)(a_01->ge_offset).x.n + lVar9 + -8);
      uVar4 = puVar1[1];
      uVar5 = puVar1[2];
      uVar6 = puVar1[3];
      puVar2 = (uint *)((long)(a_01->ge_offset).x.n + lVar9 + -8);
      *puVar2 = *puVar1 & uVar22;
      puVar2[1] = uVar4 & uVar22;
      puVar2[2] = uVar5 & uVar22;
      puVar2[3] = uVar6 & uVar22;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x40);
    return iVar8;
  }
  secp256k1_ellswift_create_cold_5();
  return 0;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_equal(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe na;
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(b);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 1);
    SECP256K1_FE_VERIFY_MAGNITUDE(b, 31);

    secp256k1_fe_negate(&na, a, 1);
    secp256k1_fe_add(&na, b);
    return secp256k1_fe_normalizes_to_zero(&na);
}